

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

Hop_Obj_t *
Abc_NodeCollapseFunc1
          (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,int *pPermFanout)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  int iVar3;
  int iVar4;
  int local_5c;
  int local_58;
  int iFanin;
  int nSize;
  int RetValue;
  Hop_Obj_t *bFanout;
  Hop_Obj_t *bFanin;
  Hop_Man_t *pMan;
  int *pPermFanout_local;
  int *pPermFanin_local;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pFanin_local;
  
  bFanin = (Hop_Obj_t *)pFanin->pNtk->pManFunc;
  pMan = (Hop_Man_t *)pPermFanout;
  pPermFanout_local = pPermFanin;
  pPermFanin_local = &vFanins->nCap;
  vFanins_local = (Vec_Ptr_t *)pFanout;
  pFanout_local = pFanin;
  iVar3 = Abc_NodeCheckDupFanin(pFanin,pFanout,&local_5c);
  if (iVar3 == 1) {
    local_58 = Abc_NodeCollapseSuppSize
                         (pFanout_local,(Abc_Obj_t *)vFanins_local,(Vec_Ptr_t *)pPermFanin_local);
    Hop_IthVar((Hop_Man_t *)bFanin,local_58);
    iVar3 = local_58 + 1;
    iVar4 = Hop_ManPiNum((Hop_Man_t *)bFanin);
    if (iVar4 < iVar3) {
      __assert_fail("nSize + 1 <= Hop_ManPiNum(pMan)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x226,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iFanin = Abc_NodeCollapsePermMap
                       (pFanout_local,(Abc_Obj_t *)0x0,(Vec_Ptr_t *)pPermFanin_local,
                        pPermFanout_local);
    if (iFanin == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x229,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iFanin = Abc_NodeCollapsePermMap
                       ((Abc_Obj_t *)vFanins_local,pFanout_local,(Vec_Ptr_t *)pPermFanin_local,
                        (int *)pMan);
    pHVar2 = bFanin;
    if (iFanin == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x22b,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    pMan->nObjs[(long)local_5c + -0x12] = local_58;
    pHVar1 = (Hop_Obj_t *)(pFanout_local->field_5).pData;
    iVar3 = Abc_ObjFaninNum(pFanout_local);
    bFanout = Hop_Permute((Hop_Man_t *)pHVar2,pHVar1,iVar3,pPermFanout_local);
    pHVar1 = bFanin;
    pHVar2 = (Hop_Obj_t *)vFanins_local[3].pArray;
    iVar3 = Abc_ObjFaninNum((Abc_Obj_t *)vFanins_local);
    _nSize = Hop_Permute((Hop_Man_t *)pHVar1,pHVar2,iVar3,(int *)pMan);
    pFanin_local = (Abc_Obj_t *)Hop_Compose((Hop_Man_t *)bFanin,_nSize,bFanout,local_58);
  }
  else {
    pFanin_local = (Abc_Obj_t *)0x0;
  }
  return (Hop_Obj_t *)pFanin_local;
}

Assistant:

Hop_Obj_t * Abc_NodeCollapseFunc1( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pFanin->pNtk->pManFunc;
    Hop_Obj_t * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    Hop_IthVar( pMan, nSize ); // use additional var for fanin variable
    assert( nSize + 1 <= Hop_ManPiNum(pMan) );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // include fanin's variable
    pPermFanout[iFanin] = nSize;
    // create new function of fanin and fanout
    bFanin  = Hop_Permute( pMan, (Hop_Obj_t *)pFanin->pData,  Abc_ObjFaninNum(pFanin),  pPermFanin );
    bFanout = Hop_Permute( pMan, (Hop_Obj_t *)pFanout->pData, Abc_ObjFaninNum(pFanout), pPermFanout );
    // compose fanin into fanout
    return Hop_Compose( pMan, bFanout, bFanin, nSize );
}